

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
           *this)

{
  ulong capacity;
  undefined1 auVar1 [16];
  size_t pos;
  size_t sVar2;
  size_t sVar3;
  byte bVar4;
  slot_type *old_slot;
  slot_type *old_slot_00;
  slot_type *old_slot_01;
  slot_type *old_slot_02;
  size_t new_capacity;
  FindInfo FVar5;
  size_t hashval;
  anon_class_16_2_f7bee600 probe_index;
  type raw;
  
  capacity = this->capacity_;
  if ((capacity == 0) || ((capacity + 1 & capacity) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<const unsigned long, LatpLon>, std::hash<unsigned long>, std::equal_to<unsigned long>, boost::interprocess::allocator<std::pair<const unsigned long, LatpLon>, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<const unsigned long, LatpLon>, Hash = std::hash<unsigned long>, Eq = std::equal_to<unsigned long>, Alloc = boost::interprocess::allocator<std::pair<const unsigned long, LatpLon>, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>]"
                 );
  }
  if (capacity < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<const unsigned long, LatpLon>, std::hash<unsigned long>, std::equal_to<unsigned long>, boost::interprocess::allocator<std::pair<const unsigned long, LatpLon>, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<const unsigned long, LatpLon>, Hash = std::hash<unsigned long>, Eq = std::equal_to<unsigned long>, Alloc = boost::interprocess::allocator<std::pair<const unsigned long, LatpLon>, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>]"
                 );
  }
  ConvertDeletedToEmptyAndFullToDeleted(this->ctrl_,capacity);
  new_capacity = 0;
  do {
    if (new_capacity == this->capacity_) {
      reset_growth_left(this,new_capacity);
      return;
    }
    if (this->ctrl_[new_capacity] == -2) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = this->slots_[new_capacity].value.first;
      hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,8) +
                SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,0);
      FVar5 = find_first_non_full(this,hashval);
      pos = FVar5.offset;
      probe_index.this = this;
      probe_index.hashval = &hashval;
      sVar2 = drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()(&probe_index,pos);
      sVar3 = drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()
                        (&probe_index,new_capacity);
      bVar4 = (byte)hashval;
      if (sVar2 == sVar3) {
        bVar4 = bVar4 & 0x7f;
      }
      else {
        if (this->ctrl_[pos] == -2) {
          set_ctrl(this,pos,bVar4 & 0x7f);
          hash_policy_traits<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,void>
          ::
          transfer<boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
                    ((allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>
                      *)&((slot_type *)&raw)->value,this->slots_ + new_capacity,old_slot_00);
          hash_policy_traits<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,void>
          ::
          transfer<boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
                    ((allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>
                      *)&this->slots_[new_capacity].value,this->slots_ + pos,old_slot_01);
          hash_policy_traits<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,void>
          ::
          transfer<boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
                    ((allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>
                      *)&this->slots_[pos].value,(slot_type *)&raw,old_slot_02);
          new_capacity = new_capacity - 1;
          goto LAB_001030b9;
        }
        if (this->ctrl_[pos] != -0x80) {
          __assert_fail("IsDeleted(ctrl_[new_i])",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x853,
                        "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<const unsigned long, LatpLon>, std::hash<unsigned long>, std::equal_to<unsigned long>, boost::interprocess::allocator<std::pair<const unsigned long, LatpLon>, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<const unsigned long, LatpLon>, Hash = std::hash<unsigned long>, Eq = std::equal_to<unsigned long>, Alloc = boost::interprocess::allocator<std::pair<const unsigned long, LatpLon>, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>]"
                       );
        }
        set_ctrl(this,pos,bVar4 & 0x7f);
        hash_policy_traits<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,void>
        ::
        transfer<boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
                  ((allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>
                    *)&this->slots_[pos].value,this->slots_ + new_capacity,old_slot);
        bVar4 = 0x80;
      }
      set_ctrl(this,new_capacity,bVar4);
    }
LAB_001030b9:
    new_capacity = new_capacity + 1;
  } while( true );
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
                                                 PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hashval);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hashval.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hashval));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hashval));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hashval));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left(capacity_);
    }